

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_create_artifact(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj_00;
  object *obj;
  artifact *art;
  char s [80];
  char prompt [80];
  wchar_t ind;
  command_conflict *cmd_local;
  
  wVar2 = cmd_get_arg_number((command *)cmd,"index",(int *)(prompt + 0x4c));
  if (wVar2 != L'\0') {
    memset(&art,0,0x50);
    strnfmt(s + 0x48,0x50,"Create which artifact (1-%d)? ",(ulong)(z_info->a_max - 1));
    _Var1 = get_string(s + 0x48,(char *)&art,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string((char *)&art,(int *)(prompt + 0x4c));
    if (!_Var1) {
      return;
    }
    cmd_set_arg_number((command *)cmd,"index",prompt._76_4_);
  }
  if (((int)prompt._76_4_ < 1) || ((int)(uint)z_info->a_max <= (int)prompt._76_4_)) {
    msg("That\'s not a valid artifact.");
  }
  else {
    obj_00 = wiz_create_object_from_artifact(a_info + (int)prompt._76_4_);
    wiz_drop_object(obj_00);
  }
  return;
}

Assistant:

void do_cmd_wiz_create_artifact(struct command *cmd)
{
	int ind;

	if (cmd_get_arg_number(cmd, "index", &ind) != CMD_OK) {
		char prompt[80];
		char s[80] = "";

		strnfmt(prompt, sizeof(prompt),
			"Create which artifact (1-%d)? ", z_info->a_max - 1);
		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &ind)) return;
		cmd_set_arg_number(cmd, "index", ind);
	}

	if (ind >= 1 && ind < z_info->a_max) {
		struct artifact *art = &a_info[ind];
		struct object *obj = wiz_create_object_from_artifact(art);

		wiz_drop_object(obj);
	} else {
		msg("That's not a valid artifact.");
	}
}